

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

void __thiscall
InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModelPrivate *this,InsertProxyModel *q)

{
  RolesContainer *local_f0;
  QList<QMap<int,_QVariant>_> *local_a8;
  Connection local_88;
  iterator local_80;
  QLatin1Char local_63;
  QChar local_62;
  QString local_60;
  enable_if_t<std::is_copy_constructible_v<QString>,_QVariant> local_48;
  int local_24;
  QMap<int,_QVariant> local_20;
  RolesContainer starHeader;
  InsertProxyModel *q_local;
  InsertProxyModelPrivate *this_local;
  
  starHeader.d.d =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )q;
  QFlags<InsertProxyModel::InsertDirection>::QFlags(&this->m_insertDirection,NoInsert);
  QList<QPersistentModelIndex>::QList(&this->m_layoutChangePersistentIndexes);
  QList<QModelIndex>::QList(&this->m_layoutChangeProxyIndexes);
  QList<QPersistentModelIndex>::QList(&this->m_layoutChangeExtraPersistentIndexes);
  QList<QModelIndex>::QList(&this->m_layoutChangeExtraProxyIndexes);
  local_a8 = this->m_extraData;
  do {
    QList<QMap<int,_QVariant>_>::QList(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != (QList<QMap<int,_QVariant>_> *)this->m_extraHeaderData);
  local_f0 = this->m_extraHeaderData;
  do {
    QMap<int,_QVariant>::QMap(local_f0);
    local_f0 = local_f0 + 1;
  } while (local_f0 != &this->m_dataForCorner);
  QMap<int,_QVariant>::QMap(&this->m_dataForCorner);
  this->m_separateEditDisplay = false;
  QList<QMetaObject::Connection>::QList(&this->m_sourceConnections);
  this->q_ptr = (InsertProxyModel *)starHeader.d.d;
  QMap<int,_QVariant>::QMap(&local_20);
  local_24 = 0;
  QLatin1Char::QLatin1Char(&local_63,'*');
  QChar::QChar(&local_62,local_63);
  QString::QString(&local_60,(QChar *)(ulong)(ushort)local_62.ucs);
  ::QVariant::fromValue<QString>(&local_48,&local_60);
  local_80._M_node = (_Base_ptr)QMap<int,_QVariant>::insert(&local_20,&local_24,&local_48);
  ::QVariant::~QVariant(&local_48);
  QString::~QString(&local_60);
  QMap<int,_QVariant>::operator=(this->m_extraHeaderData + 1,&local_20);
  QMap<int,_QVariant>::operator=(this->m_extraHeaderData,&local_20);
  QObject::
  connect<void(InsertProxyModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModel*)::__0>
            ((QObject *)&local_88,this->q_ptr,
             (offset_in_InsertProxyModel_to_subr)InsertProxyModel::extraDataChanged,
             (anon_class_8_1_8991fb9c_for_function)0x0);
  QMetaObject::Connection::~Connection(&local_88);
  QMap<int,_QVariant>::~QMap(&local_20);
  return;
}

Assistant:

InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModel *q)
    : q_ptr(q)
    , m_insertDirection(InsertProxyModel::NoInsert)
    , m_separateEditDisplay(false)
{
    Q_ASSERT(q_ptr);
    RolesContainer starHeader;
    starHeader.insert(Qt::DisplayRole, QVariant::fromValue(QString(QLatin1Char('*'))));
    m_extraHeaderData[true] = starHeader;
    m_extraHeaderData[false] = starHeader;
    QObject::connect(q_ptr, &InsertProxyModel::extraDataChanged,
                     [this](const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles) -> void {
                         checkExtraDataChanged(topLeft, bottomRight, roles);
                     });
}